

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  long *__s1;
  int iVar1;
  char *__s1_00;
  bool bVar2;
  string c;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,FLAGS_gtest_color_abi_cxx11_,
             DAT_00154608 + FLAGS_gtest_color_abi_cxx11_);
  __s1 = local_48[0];
  if (local_48[0] != (long *)0x0) {
    iVar1 = strcasecmp((char *)local_48[0],"auto");
    if (iVar1 == 0) {
      __s1_00 = getenv("TERM");
      if (__s1_00 == (char *)0x0) {
        bVar2 = false;
      }
      else {
        iVar1 = strcmp(__s1_00,"xterm");
        bVar2 = true;
        if (iVar1 != 0) {
          iVar1 = strcmp(__s1_00,"xterm-color");
          if (iVar1 != 0) {
            iVar1 = strcmp(__s1_00,"xterm-256color");
            if (iVar1 != 0) {
              iVar1 = strcmp(__s1_00,"screen");
              if (iVar1 != 0) {
                iVar1 = strcmp(__s1_00,"screen-256color");
                if (iVar1 != 0) {
                  iVar1 = strcmp(__s1_00,"tmux");
                  if (iVar1 != 0) {
                    iVar1 = strcmp(__s1_00,"tmux-256color");
                    if (iVar1 != 0) {
                      iVar1 = strcmp(__s1_00,"rxvt-unicode");
                      if (iVar1 != 0) {
                        iVar1 = strcmp(__s1_00,"rxvt-unicode-256color");
                        if (iVar1 != 0) {
                          iVar1 = strcmp(__s1_00,"linux");
                          if (iVar1 != 0) {
                            iVar1 = strcmp(__s1_00,"cygwin");
                            bVar2 = iVar1 == 0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      bVar2 = (bool)(bVar2 & stdout_is_tty);
      goto LAB_00118795;
    }
    iVar1 = strcasecmp((char *)__s1,"yes");
    bVar2 = true;
    if (iVar1 == 0) goto LAB_00118795;
    iVar1 = strcasecmp((char *)__s1,"true");
    if (iVar1 == 0) goto LAB_00118795;
    iVar1 = strcasecmp((char *)__s1,"t");
    if (iVar1 == 0) goto LAB_00118795;
    if ((char)*__s1 == '1') {
      bVar2 = *(char *)((long)__s1 + 1) == '\0';
      goto LAB_00118795;
    }
  }
  bVar2 = false;
LAB_00118795:
  if (__s1 != local_38) {
    operator_delete(__s1,local_38[0] + 1);
  }
  return bVar2;
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  std::string c = GTEST_FLAG_GET(color);
  const char* const gtest_color = c.c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if GTEST_OS_WINDOWS && !GTEST_OS_WINDOWS_MINGW
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        String::CStringEquals(term, "xterm") ||
        String::CStringEquals(term, "xterm-color") ||
        String::CStringEquals(term, "xterm-256color") ||
        String::CStringEquals(term, "screen") ||
        String::CStringEquals(term, "screen-256color") ||
        String::CStringEquals(term, "tmux") ||
        String::CStringEquals(term, "tmux-256color") ||
        String::CStringEquals(term, "rxvt-unicode") ||
        String::CStringEquals(term, "rxvt-unicode-256color") ||
        String::CStringEquals(term, "linux") ||
        String::CStringEquals(term, "cygwin");
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
      String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}